

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlrelationaltablemodel.cpp
# Opt level: O2

QString * __thiscall
QSqlRelationalTableModelPrivate::fullyQualifiedFieldName
          (QString *__return_storage_ptr__,QSqlRelationalTableModelPrivate *this,QString *tableName,
          QString *fieldName)

{
  QChar QVar1;
  QString *pQVar2;
  
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  QString::reserve(__return_storage_ptr__,(tableName->d).size + (fieldName->d).size + 1);
  QVar1.ucs = QString::append(__return_storage_ptr__);
  pQVar2 = (QString *)QString::append(QVar1);
  QString::append(pQVar2);
  return __return_storage_ptr__;
}

Assistant:

QString QSqlRelationalTableModelPrivate::fullyQualifiedFieldName(const QString &tableName,
                                                                 const QString &fieldName) const
{
    QString ret;
    ret.reserve(tableName.size() + fieldName.size() + 1);
    ret.append(tableName).append(u'.').append(fieldName);

    return ret;
}